

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86_avx512::forward
          (Crop_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat *this_00;
  void *pvVar5;
  long *plVar6;
  Allocator *pAVar7;
  long *plVar8;
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined8 uVar29;
  int *piVar30;
  pointer pMVar31;
  undefined1 auVar32 [40];
  undefined1 auVar33 [64];
  int iVar34;
  undefined8 *puVar35;
  pointer pMVar36;
  int *piVar37;
  sbyte sVar38;
  int iVar39;
  undefined8 uVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  undefined7 uVar46;
  undefined4 uVar47;
  Mat *pMVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  int iVar52;
  bool bVar53;
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  int _outw;
  int _outh;
  int _woffset;
  uint local_1d8;
  int _outc;
  int _outd;
  int _hoffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  Mat m_1;
  int _coffset;
  int _doffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  
  pMVar48 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1d8 = pMVar48->w;
  uVar43 = pMVar48->h;
  iVar34 = pMVar48->d;
  iVar39 = pMVar48->c;
  iVar44 = pMVar48->dims;
  uVar51 = pMVar48->elemsize;
  iVar1 = pMVar48->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar48 >> 3) *
               -0x71c71c71c71c71c7,(allocator_type *)&m_1);
    pMVar36 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar36) {
      lVar49 = 0;
      uVar50 = 0;
      do {
        pMVar31 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        switch(*(undefined4 *)((long)&pMVar36->dims + lVar49)) {
        case 1:
          uVar42 = (long)*(int *)((long)&pMVar36->elempack + lVar49) *
                   (long)*(int *)((long)&pMVar36->w + lVar49);
          auVar55._8_4_ = 1;
          auVar55._0_8_ = 0x100000001;
          auVar55._12_4_ = 1;
          auVar55 = vpinsrd_avx(auVar55,(int)uVar42,1);
          break;
        case 2:
          iVar52 = *(int *)((long)&pMVar36->w + lVar49);
          lVar41 = (long)*(int *)((long)&pMVar36->elempack + lVar49) *
                   (long)*(int *)((long)&pMVar36->h + lVar49);
          auVar55 = vpinsrd_avx(ZEXT416(2),iVar52,1);
          auVar55 = vpinsrd_avx(auVar55,(int)lVar41,2);
          auVar55 = vpinsrd_avx(auVar55,1,3);
          uVar42 = lVar41 * iVar52;
          break;
        case 3:
          iVar2 = *(int *)((long)&pMVar36->w + lVar49);
          iVar3 = *(int *)((long)&pMVar36->h + lVar49);
          iVar52 = *(int *)((long)&pMVar36->elempack + lVar49) *
                   *(int *)((long)&pMVar36->c + lVar49);
          auVar55 = vpinsrd_avx(ZEXT416(3),iVar2,1);
          auVar55 = vpinsrd_avx(auVar55,iVar3,2);
          auVar55 = vpinsrd_avx(auVar55,1,3);
          lVar41 = (long)iVar3 * (long)iVar2;
          goto LAB_00277e56;
        case 4:
          iVar2 = *(int *)((long)&pMVar36->w + lVar49);
          iVar3 = *(int *)((long)&pMVar36->h + lVar49);
          iVar4 = *(int *)((long)&pMVar36->d + lVar49);
          iVar52 = *(int *)((long)&pMVar36->elempack + lVar49) *
                   *(int *)((long)&pMVar36->c + lVar49);
          auVar55 = vpinsrd_avx(ZEXT416(4),iVar2,1);
          auVar55 = vpinsrd_avx(auVar55,iVar3,2);
          auVar55 = vpinsrd_avx(auVar55,iVar4,3);
          lVar41 = (long)iVar3 * (long)iVar2 * (long)iVar4;
LAB_00277e56:
          uVar47 = 1;
          uVar42 = lVar41 + 3U & 0x3ffffffffffffffc;
          uVar40 = 4;
          goto LAB_00277eb0;
        default:
          uVar42 = 0;
          iVar52 = 0;
          auVar55 = (undefined1  [16])0x0;
          uVar40 = 0;
          uVar47 = 0;
          goto LAB_00277eb0;
        }
        iVar52 = 1;
        uVar40 = 4;
        uVar47 = 1;
LAB_00277eb0:
        piVar37 = *(int **)((long)&(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->refcount + lVar49);
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 == 0) {
            pvVar5 = *(void **)((long)&(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar49);
            plVar6 = *(long **)((long)&(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->allocator +
                               lVar49);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        puVar35 = (undefined8 *)((long)&pMVar31->data + lVar49);
        *(undefined8 *)((long)&pMVar31->cstep + lVar49) = 0;
        *(undefined8 *)((long)puVar35 + 0xc) = 0;
        *(undefined8 *)((long)puVar35 + 0x14) = 0;
        *puVar35 = 0;
        puVar35[1] = 0;
        puVar35 = (undefined8 *)((long)&pMVar31->data + lVar49);
        *puVar35 = 0;
        puVar35[1] = 0;
        *(undefined8 *)((long)&pMVar31->elemsize + lVar49) = uVar40;
        *(undefined4 *)((long)&pMVar31->elempack + lVar49) = uVar47;
        *(undefined8 *)((long)&pMVar31->allocator + lVar49) = 0;
        *(undefined1 (*) [16])((long)&pMVar31->dims + lVar49) = auVar55;
        *(int *)((long)&pMVar31->c + lVar49) = iVar52;
        *(ulong *)((long)&pMVar31->cstep + lVar49) = uVar42;
        uVar50 = uVar50 + 1;
        pMVar36 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar49 = lVar49 + 0x48;
      } while (uVar50 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar36 >>
                                3) * -0x71c71c71c71c71c7));
    }
    piVar37 = &_doffset;
    Crop::eval_crop_expr
              (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,piVar37,&_coffset,&_outw,
               &_outh,&_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    goto LAB_00278023;
  }
  if ((this->super_Crop).woffset == -0xe9) {
    switch(iVar44) {
    case 1:
      break;
    case 2:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
      goto LAB_00278584;
    case 3:
      break;
    case 4:
      break;
    default:
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00278584;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
LAB_00278584:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    piVar37 = &_hoffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,(Mat *)&bottom_blob_shapes,(int *)pMVar48[1].data,&_woffset,piVar37
               ,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
    piVar30 = (int *)CONCAT44(bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              bottom_blob_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_);
    if (piVar30 != (int *)0x0) {
      LOCK();
      *piVar30 = *piVar30 + -1;
      UNLOCK();
      if ((*piVar30 != 0) ||
         (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0)) goto LAB_00278023;
      goto LAB_0027938d;
    }
    goto LAB_00278023;
  }
  switch(iVar44) {
  case 1:
    break;
  case 2:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
    goto LAB_00278637;
  case 3:
    break;
  case 4:
    break;
  default:
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_00278637;
  }
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000004;
LAB_00278637:
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar47 = m_1._60_4_;
  switch(pMVar48[1].dims) {
  case 1:
    m_1.cstep = (long)pMVar48[1].elempack * (long)pMVar48[1].w;
    m_1._0_24_ = ZEXT824(4) << 0x80;
    m_1.elempack = 1;
    m_1.allocator = (Allocator *)0x0;
    m_1.dims = 1;
    m_1.w = (int)m_1.cstep;
    m_1.h = 1;
    m_1.d = 1;
    m_1.c = 1;
    m_1._0_64_ = CONCAT460(uVar47,m_1._0_60_);
    break;
  case 2:
    lVar49 = (long)pMVar48[1].elempack * (long)pMVar48[1].h;
    m_1._0_24_ = ZEXT824(4) << 0x80;
    m_1.elempack = 1;
    m_1.allocator = (Allocator *)0x0;
    m_1.dims = 2;
    m_1.w = pMVar48[1].w;
    m_1.h = (int)lVar49;
    m_1.d = 1;
    m_1.c = 1;
    m_1._0_64_ = CONCAT460(uVar47,m_1._0_60_);
    m_1.cstep = lVar49 * pMVar48[1].w;
    break;
  case 3:
    m_1._0_24_ = ZEXT824(4) << 0x80;
    m_1.elempack = 1;
    m_1.allocator = (Allocator *)0x0;
    m_1.dims = 3;
    m_1.w = pMVar48[1].w;
    m_1.h = pMVar48[1].h;
    m_1.d = 1;
    m_1.c = pMVar48[1].elempack * pMVar48[1].c;
    lVar49 = (long)pMVar48[1].h * (long)pMVar48[1].w;
    goto LAB_002787aa;
  case 4:
    m_1._0_24_ = ZEXT824(4) << 0x80;
    m_1.elempack = 1;
    m_1.allocator = (Allocator *)0x0;
    m_1.dims = 4;
    m_1.w = pMVar48[1].w;
    m_1.h = pMVar48[1].h;
    m_1.d = pMVar48[1].d;
    m_1.c = pMVar48[1].elempack * pMVar48[1].c;
    lVar49 = (long)pMVar48[1].h * (long)pMVar48[1].w * (long)pMVar48[1].d;
LAB_002787aa:
    m_1.data = (void *)m_1.data;
    m_1.refcount = (int *)m_1.refcount;
    m_1.elemsize = m_1.elemsize;
    m_1.elempack = m_1.elempack;
    m_1._28_4_ = m_1._28_4_;
    m_1.allocator = (Allocator *)m_1.allocator;
    m_1.dims = m_1.dims;
    m_1.w = m_1.w;
    m_1.h = m_1.h;
    m_1.d = m_1.d;
    m_1.c = m_1.c;
    m_1._0_64_ = CONCAT460(uVar47,m_1._0_60_);
    m_1.cstep = lVar49 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m_1.cstep = 0;
    m_1._0_28_ = ZEXT1228((undefined1  [12])0x0);
    m_1._0_60_ = ZEXT3260((undefined1  [32])m_1._0_32_);
    m_1._0_64_ = CONCAT460(uVar47,m_1._0_60_);
  }
  piVar37 = &_hoffset;
  Crop::resolve_crop_roi
            (&this->super_Crop,(Mat *)&bottom_blob_shapes,&m_1,&_woffset,piVar37,&_doffset,&_coffset
             ,&_outw,&_outh,&_outd,&_outc);
  if (m_1.refcount != (int *)0x0) {
    LOCK();
    *m_1.refcount = *m_1.refcount + -1;
    UNLOCK();
    if (*m_1.refcount == 0) {
      if (m_1.allocator == (Allocator *)0x0) {
        if (m_1.data != (void *)0x0) {
          free(m_1.data);
        }
      }
      else {
        (*(m_1.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar30 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if ((*piVar30 == 0) &&
       (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
LAB_0027938d:
      free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
LAB_00278023:
  uVar46 = (undefined7)((ulong)piVar37 >> 8);
  if (iVar1 != 4) {
    if (iVar1 != 8) {
      if ((iVar1 != 0x10) || (3 < iVar44 - 1U)) goto switchD_002781eb_default;
      switch(iVar44) {
      case 1:
        if ((_outw & 0xfU) != 0) goto switchD_002781eb_default;
        if (_outw >> 4 != local_1d8) {
          if ((_woffset & 0xfU) == 0) {
            Mat::create(this_00,_outw >> 4,uVar51 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              iVar34 = _woffset + 0xf;
              if (-1 < _woffset) {
                iVar34 = _woffset;
              }
              crop_pack16_avx512(pMVar48,this_00,0,iVar34 >> 4);
              return 0;
            }
            return -100;
          }
          goto switchD_002781eb_default;
        }
        if (this_00 == pMVar48) {
          return 0;
        }
        piVar37 = pMVar48->refcount;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + 1;
          UNLOCK();
        }
        piVar37 = this_00->refcount;
        if (piVar37 == (int *)0x0) goto LAB_00279c0a;
        LOCK();
        *piVar37 = *piVar37 + -1;
        UNLOCK();
        if (*piVar37 != 0) goto LAB_00279c0a;
        pvVar5 = this_00->data;
        pAVar7 = this_00->allocator;
        break;
      case 2:
        if ((_outh & 0xfU) == 0) {
          iVar34 = 0x10;
        }
        else if ((_outh & 7U) == 0) {
          iVar34 = 8;
        }
        else {
          iVar34 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outw != local_1d8) || (iVar34 != 0x10)) || (_outh / iVar34 != uVar43)) {
          if ((iVar34 == 0x10) && ((_hoffset & 0xfU) == 0)) {
            iVar34 = _outh + 0xf;
            if (-1 < _outh) {
              iVar34 = _outh;
            }
            Mat::create(this_00,_outw,iVar34 >> 4,uVar51 & 0xfffffffffffffff0,0x10,
                        opt->blob_allocator);
            if (this_00->data != (void *)0x0) {
              if ((long)this_00->c * this_00->cstep != 0) {
                iVar34 = _hoffset + 0xf;
                if (-1 < _hoffset) {
                  iVar34 = _hoffset;
                }
                crop_pack16_avx512(pMVar48,this_00,iVar34 >> 4,_woffset);
                return 0;
              }
              return -100;
            }
            return -100;
          }
          goto switchD_002781eb_default;
        }
        if (this_00 == pMVar48) {
          return 0;
        }
        piVar37 = pMVar48->refcount;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + 1;
          UNLOCK();
        }
        piVar37 = this_00->refcount;
        if (piVar37 == (int *)0x0) goto LAB_00279c0a;
        LOCK();
        *piVar37 = *piVar37 + -1;
        UNLOCK();
        if (*piVar37 != 0) goto LAB_00279c0a;
        pvVar5 = this_00->data;
        pAVar7 = this_00->allocator;
        break;
      case 3:
        if ((_outc & 0xfU) == 0) {
          uVar45 = 0x10;
        }
        else if ((_outc & 7U) == 0) {
          uVar45 = 8;
        }
        else {
          uVar45 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        bVar53 = uVar43 == _outh;
        bVar9 = local_1d8 == _outw;
        if (((!bVar53 || !bVar9) || (uVar45 != 0x10)) || (_outc / (int)uVar45 != iVar39)) {
          if (uVar45 != 0x10 || (_coffset & 0xfU) != 0) goto switchD_002781eb_default;
          iVar34 = _outc + 0xf;
          if (-1 < _outc) {
            iVar34 = _outc;
          }
          iVar34 = iVar34 >> 4;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pMVar48->elemsize;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)(_coffset >> 4) * pMVar48->cstep *
                         (long)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)pMVar48->data);
          iVar39 = pMVar48->elempack;
          pAVar7 = pMVar48->allocator;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          uVar23 = pMVar48->dims;
          uVar24 = pMVar48->w;
          uVar25 = pMVar48->h;
          uVar26 = pMVar48->d;
          uVar50 = ((long)pMVar48->d *
                    (long)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage *
                    (long)pMVar48->h * (long)pMVar48->w + 0xfU & 0xfffffffffffffff0) /
                   (ulong)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
          if (bVar53 && bVar9) {
            Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,opt->blob_allocator,iVar34,
                       (void *)CONCAT71(uVar46,bVar53 && bVar9));
            piVar37 = m_1.refcount;
            auVar54 = (undefined1  [64])m_1._0_64_;
            if (this_00 != &m_1) {
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + 1;
                UNLOCK();
              }
              piVar37 = this_00->refcount;
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + -1;
                UNLOCK();
                if (*piVar37 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    if (this_00->data != (void *)0x0) {
                      free(this_00->data);
                    }
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              auVar54 = (undefined1  [64])m_1._0_64_;
              this_00->data = m_1.data;
              this_00->refcount = m_1.refcount;
              this_00->elemsize = m_1.elemsize;
              this_00->elempack = m_1.elempack;
              this_00->allocator = m_1.allocator;
              this_00->dims = m_1.dims;
              this_00->w = m_1.w;
              this_00->h = m_1.h;
              this_00->d = m_1.d;
              m_1.c = auVar54._56_4_;
              this_00->c = m_1.c;
              this_00->cstep = m_1.cstep;
              piVar37 = m_1.refcount;
            }
            m_1._0_64_ = auVar54;
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar34 = -100;
            if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
              iVar34 = _outc + 0xf;
              if (-1 < _outc) {
                iVar34 = _outc;
              }
              iVar34 = iVar34 >> 4;
              goto LAB_0027a07a;
            }
          }
          else {
LAB_0027a07a:
            Mat::create(this_00,_outw,_outh,iVar34,(ulong)uVar45 * (uVar51 >> 4),0x10,
                        opt->blob_allocator);
            iVar34 = -100;
            if ((this_00->data != (void *)0x0) && (this_00->cstep * (long)this_00->c != 0)) {
              if (0 < this_00->c) {
                lVar49 = 0;
                do {
                  auVar54 = (undefined1  [64])m_1._0_64_;
                  m_1.refcount = (int *)0x0;
                  m_1.data = (void **)((long)&(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->data +
                                      uVar50 * lVar49 *
                                      (long)bottom_blob_shapes.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  m_1.elemsize = (size_t)bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                  m_1._28_36_ = auVar54._28_36_;
                  m_1.elempack = iVar39;
                  auVar33 = (undefined1  [64])m_1._0_64_;
                  m_1._40_24_ = auVar54._40_24_;
                  m_1._0_32_ = auVar33._0_32_;
                  m_1.allocator = pAVar7;
                  auVar32 = (undefined1  [40])m_1._0_40_;
                  m_1.w = uVar24;
                  m_1.h = uVar25;
                  m_1.d = 1;
                  m_1._60_4_ = auVar54._60_4_;
                  m_1.c = uVar26;
                  m_1.dims = uVar23 + -1;
                  m_1._0_44_ = CONCAT440(m_1.dims,auVar32);
                  m_1.cstep = ((long)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage *
                               (long)(int)uVar25 * (long)(int)uVar24 + 0xfU & 0xfffffffffffffff0) /
                              (ulong)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                  if (uVar23 == 4) {
                    m_1.cstep = (long)(int)uVar25 * (long)(int)uVar24;
                  }
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(this_00->cstep * lVar49 *
                                 (long)bottom_blobs_unpacked.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage +
                                (long)this_00->data);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  crop_pack16_avx512(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                  lVar49 = lVar49 + 1;
                } while (lVar49 < this_00->c);
              }
              iVar34 = 0;
            }
          }
          piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          if (piVar37 == (int *)0x0) {
            return iVar34;
          }
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 != 0) {
            return iVar34;
          }
          if (pAVar7 != (Allocator *)0x0) {
            (*pAVar7->_vptr_Allocator[3])();
            return iVar34;
          }
          goto joined_r0x0027a8e1;
        }
        if (this_00 == pMVar48) {
          return 0;
        }
        piVar37 = pMVar48->refcount;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + 1;
          UNLOCK();
        }
        piVar37 = this_00->refcount;
        if (piVar37 == (int *)0x0) goto LAB_00279c0a;
        LOCK();
        *piVar37 = *piVar37 + -1;
        UNLOCK();
        if (*piVar37 != 0) goto LAB_00279c0a;
        pvVar5 = this_00->data;
        pAVar7 = this_00->allocator;
        break;
      case 4:
        if ((_outc & 0xfU) == 0) {
          uVar50 = 0x10;
        }
        else if ((_outc & 7U) == 0) {
          uVar50 = 8;
        }
        else {
          uVar50 = (ulong)((uint)((_outc & 3U) == 0) * 3 + 1);
        }
        iVar44 = (int)uVar50;
        if (((iVar34 != _outd || (uVar43 != _outh || local_1d8 != _outw)) || (iVar44 != 0x10)) ||
           (_outc / iVar44 != iVar39)) {
          if (iVar44 != 0x10 || (_coffset & 0xfU) != 0) goto switchD_002781eb_default;
          iVar39 = _outc + 0xf;
          if (-1 < _outc) {
            iVar39 = _outc;
          }
          uVar45 = iVar39 >> 4;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pMVar48->elemsize;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)(_coffset >> 4) * pMVar48->cstep *
                         (long)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)pMVar48->data);
          iVar39 = pMVar48->elempack;
          pAVar7 = pMVar48->allocator;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          uVar27 = pMVar48->w;
          uVar28 = pMVar48->h;
          uVar42 = ((long)pMVar48->d *
                    (long)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage *
                    (long)pMVar48->h * (long)pMVar48->w + 0xfU & 0xfffffffffffffff0) /
                   (ulong)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
          if (iVar34 != _outd || (uVar43 != _outh || local_1d8 != _outw)) {
LAB_0027a6bc:
            Mat::create(this_00,_outw,_outh,_outd,uVar45,uVar50 * (uVar51 >> 4),0x10,
                        opt->blob_allocator);
            iVar34 = -100;
            if (this_00->data != (void *)0x0) {
              uVar51 = (ulong)this_00->c;
              if (this_00->cstep * uVar51 != 0) {
                if (0 < this_00->c) {
                  uVar50 = (ulong)(uint)_outd;
                  lVar49 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      lVar41 = 0;
                      do {
                        auVar54 = (undefined1  [64])m_1._0_64_;
                        m_1.cstep = (long)(int)uVar28 * (long)(int)uVar27;
                        m_1.refcount = (int *)0x0;
                        m_1.data = (void *)((long)&(bottom_blob_shapes.
                                                                                                        
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data +
                                           (long)(_doffset + (int)lVar41) *
                                           (long)bottom_blob_shapes.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           * m_1.cstep +
                                           uVar42 * lVar49 *
                                           (long)bottom_blob_shapes.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                        ;
                        m_1.elemsize = (size_t)bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        m_1._28_36_ = auVar54._28_36_;
                        m_1.elempack = iVar39;
                        m_1.allocator = pAVar7;
                        m_1.dims = 2;
                        m_1.w = uVar27;
                        m_1.h = uVar28;
                        m_1._60_4_ = auVar54._60_4_;
                        m_1.d = 1;
                        m_1.c = 1;
                        bottom_blobs_unpacked.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
                        bottom_blobs_unpacked.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start =
                             (pointer)((long)this_00->data +
                                      lVar41 * (long)bottom_blobs_unpacked.
                                                                                                          
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                      * (long)this_00->h * (long)this_00->w +
                                      this_00->cstep * lVar49 *
                                      (long)bottom_blobs_unpacked.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        bottom_blobs_unpacked.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x0;
                        crop_pack16_avx512(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                        uVar50 = (ulong)_outd;
                        lVar41 = lVar41 + 1;
                      } while (lVar41 < (long)uVar50);
                      uVar51 = (ulong)(uint)this_00->c;
                    }
                    lVar49 = lVar49 + 1;
                  } while (lVar49 < (int)uVar51);
                }
                iVar34 = 0;
              }
            }
          }
          else {
            Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,opt->blob_allocator,_outd,
                       (void *)(ulong)uVar45);
            piVar37 = m_1.refcount;
            auVar54 = (undefined1  [64])m_1._0_64_;
            if (this_00 != &m_1) {
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + 1;
                UNLOCK();
              }
              piVar37 = this_00->refcount;
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + -1;
                UNLOCK();
                if (*piVar37 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    if (this_00->data != (void *)0x0) {
                      free(this_00->data);
                    }
                  }
                  else {
                    (*this_00->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              auVar54 = (undefined1  [64])m_1._0_64_;
              this_00->data = m_1.data;
              this_00->refcount = m_1.refcount;
              this_00->elemsize = m_1.elemsize;
              this_00->elempack = m_1.elempack;
              this_00->allocator = m_1.allocator;
              this_00->dims = m_1.dims;
              this_00->w = m_1.w;
              this_00->h = m_1.h;
              this_00->d = m_1.d;
              m_1.c = auVar54._56_4_;
              this_00->c = m_1.c;
              this_00->cstep = m_1.cstep;
              piVar37 = m_1.refcount;
            }
            m_1._0_64_ = auVar54;
            if (piVar37 != (int *)0x0) {
              LOCK();
              *piVar37 = *piVar37 + -1;
              UNLOCK();
              if (*piVar37 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar34 = -100;
            if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
              iVar34 = _outc + 0xf;
              if (-1 < _outc) {
                iVar34 = _outc;
              }
              uVar45 = iVar34 >> 4;
              goto LAB_0027a6bc;
            }
          }
          piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          if (piVar37 == (int *)0x0) {
            return iVar34;
          }
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 != 0) {
            return iVar34;
          }
          if (pAVar7 != (Allocator *)0x0) {
            (*pAVar7->_vptr_Allocator[3])();
            return iVar34;
          }
          goto joined_r0x0027a8e1;
        }
        if (this_00 == pMVar48) {
          return 0;
        }
        piVar37 = pMVar48->refcount;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + 1;
          UNLOCK();
        }
        piVar37 = this_00->refcount;
        if (piVar37 == (int *)0x0) goto LAB_00279c0a;
        LOCK();
        *piVar37 = *piVar37 + -1;
        UNLOCK();
        if (*piVar37 != 0) goto LAB_00279c0a;
        pvVar5 = this_00->data;
        pAVar7 = this_00->allocator;
      }
      goto joined_r0x00278277;
    }
    switch(iVar44) {
    case 1:
      uVar43 = _outw & 7;
      bVar53 = (_outw & 3U) == 0;
      iVar34 = 8;
      if (uVar43 != 0) {
        iVar34 = (uint)bVar53 * 3 + 1;
      }
      sVar38 = 3;
      if (uVar43 != 0) {
        sVar38 = bVar53 * '\x02';
      }
      if (local_1d8 != _outw / iVar34 || uVar43 != 0) {
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(this_00,_outw / iVar34,(uVar51 >> 3) << sVar38,8,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            iVar34 = _woffset + 7;
            if (-1 < _woffset) {
              iVar34 = _woffset;
            }
            crop_pack8_avx(pMVar48,this_00,0,iVar34 >> 3);
            return 0;
          }
          return -100;
        }
        goto switchD_002781eb_default;
      }
      if (this_00 == pMVar48) {
        return 0;
      }
      piVar37 = pMVar48->refcount;
      if (piVar37 != (int *)0x0) {
        LOCK();
        *piVar37 = *piVar37 + 1;
        UNLOCK();
      }
      piVar37 = this_00->refcount;
      if (piVar37 == (int *)0x0) goto LAB_00279c0a;
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 != 0) goto LAB_00279c0a;
      pvVar5 = this_00->data;
      pAVar7 = this_00->allocator;
      goto joined_r0x00278277;
    case 2:
      sVar38 = 3;
      if ((_outh & 7U) != 0) {
        sVar38 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == local_1d8) {
        iVar34 = 8;
        if ((_outh & 7U) != 0) {
          iVar34 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) == 0) && (_outh / iVar34 == uVar43)) {
          if (this_00 == pMVar48) {
            return 0;
          }
          piVar37 = pMVar48->refcount;
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + 1;
            UNLOCK();
          }
          piVar37 = this_00->refcount;
          if (piVar37 == (int *)0x0) goto LAB_00279c0a;
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 != 0) goto LAB_00279c0a;
          pvVar5 = this_00->data;
          pAVar7 = this_00->allocator;
          goto joined_r0x00278277;
        }
      }
      if (((_hoffset | _outh) & 7U) == 0) {
        iVar34 = _outh + 7;
        if (-1 < _outh) {
          iVar34 = _outh;
        }
        Mat::create(this_00,_outw,iVar34 >> 3,(uVar51 >> 3) << sVar38,8,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep != 0) {
            iVar34 = _hoffset + 7;
            if (-1 < _hoffset) {
              iVar34 = _hoffset;
            }
            crop_pack8_avx(pMVar48,this_00,iVar34 >> 3,_woffset);
            return 0;
          }
          return -100;
        }
        return -100;
      }
switchD_002781eb_default:
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&bottom_blobs_unpacked,
                 ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
                 (allocator_type *)&bottom_blob_shapes);
      pMVar36 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar36) {
        lVar49 = 0;
        uVar51 = 0;
        do {
          piVar37 = *(int **)((long)&pMVar36->refcount + lVar49);
          puVar35 = (undefined8 *)((long)&pMVar36->data + lVar49);
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*puVar35;
          uVar40 = puVar35[1];
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (undefined4)uVar40;
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)uVar40 >> 0x20);
          bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((long)&pMVar36->elemsize + lVar49);
          uVar47 = *(undefined4 *)((long)&pMVar36->elempack + lVar49);
          plVar6 = *(long **)((long)&pMVar36->allocator + lVar49);
          puVar35 = (undefined8 *)((long)&pMVar36->dims + lVar49);
          uVar40 = *puVar35;
          uVar29 = puVar35[1];
          iVar34 = *(int *)((long)&pMVar36->c + lVar49);
          lVar41 = *(long *)((long)&pMVar36->cstep + lVar49);
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + 1;
            UNLOCK();
          }
          if (iVar1 == 1) {
LAB_002799fc:
            pMVar36 = bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pMVar48 = (Mat *)((long)&(bottom_blobs_unpacked.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data + lVar49);
            bVar53 = true;
            piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (pMVar48 != (Mat *)&bottom_blob_shapes) {
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + 1;
                UNLOCK();
              }
              piVar37 = *(int **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->refcount +
                                 lVar49);
              if (piVar37 != (int *)0x0) {
                LOCK();
                *piVar37 = *piVar37 + -1;
                UNLOCK();
                if (*piVar37 == 0) {
                  pvVar5 = *(void **)((long)&(bottom_blobs_unpacked.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->data +
                                     lVar49);
                  plVar8 = *(long **)((long)&(bottom_blobs_unpacked.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->allocator
                                     + lVar49);
                  if (plVar8 == (long *)0x0) {
                    if (pvVar5 != (void *)0x0) {
                      free(pvVar5);
                    }
                  }
                  else {
                    (**(code **)(*plVar8 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar36->cstep + lVar49) = 0;
              *(undefined1 (*) [16])((long)&pMVar48->refcount + 4) = (undefined1  [16])0x0;
              pMVar48->data = (void *)0x0;
              pMVar48->refcount = (int *)0x0;
              *(undefined1 (*) [16])((long)&pMVar36->dims + lVar49) = (undefined1  [16])0x0;
              *(undefined4 *)((long)&pMVar36->c + lVar49) = 0;
              piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                        bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._0_4_);
              puVar35 = (undefined8 *)((long)&pMVar36->data + lVar49);
              *puVar35 = bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start;
              puVar35[1] = CONCAT44(bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
              *(pointer *)((long)&pMVar36->elemsize + lVar49) =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              *(undefined4 *)((long)&pMVar36->elempack + lVar49) = uVar47;
              *(long **)((long)&pMVar36->allocator + lVar49) = plVar6;
              puVar35 = (undefined8 *)((long)&pMVar36->dims + lVar49);
              *puVar35 = uVar40;
              puVar35[1] = uVar29;
              *(int *)((long)&pMVar36->c + lVar49) = iVar34;
              *(long *)((long)&pMVar36->cstep + lVar49) = lVar41;
            }
          }
          else {
            auVar54 = vmovdqu64_avx512f((undefined1  [64])*opt);
            auVar54 = vmovdqu64_avx512f(auVar54);
            m_1._16_48_ = auVar54._16_48_;
            m_1.data = auVar54._0_8_;
            m_1.refcount = (int *)opt->workspace_allocator;
            convert_packing((Mat *)((long)&((bottom_blobs->
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->data +
                                   lVar49),(Mat *)&bottom_blob_shapes,1,(Option *)&m_1);
            if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) && (iVar34 * lVar41 != 0)
               ) goto LAB_002799fc;
            piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      bottom_blob_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._0_4_);
            bVar53 = false;
          }
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              if (plVar6 == (long *)0x0) {
                if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          if (!bVar53) {
            iVar34 = -100;
            goto LAB_00279b78;
          }
          uVar51 = uVar51 + 1;
          pMVar36 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          lVar49 = lVar49 + 0x48;
        } while (uVar51 < (ulong)(((long)(bottom_blobs->
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar36
                                  >> 3) * -0x71c71c71c71c71c7));
      }
      iVar34 = Crop::forward(&this->super_Crop,&bottom_blobs_unpacked,top_blobs,opt);
LAB_00279b78:
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
      return iVar34;
    case 3:
      goto switchD_002781eb_caseD_3;
    case 4:
      sVar38 = 3;
      if ((_outc & 7U) != 0) {
        sVar38 = ((_outc & 3U) == 0) * '\x02';
      }
      if (iVar34 == _outd && (uVar43 == _outh && local_1d8 == _outw)) {
        iVar44 = 8;
        if ((_outc & 7U) != 0) {
          iVar44 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar44 == iVar39)) {
          if (this_00 == pMVar48) {
            return 0;
          }
          piVar37 = pMVar48->refcount;
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + 1;
            UNLOCK();
          }
          piVar37 = this_00->refcount;
          if (piVar37 == (int *)0x0) goto LAB_00279c0a;
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 != 0) goto LAB_00279c0a;
          pvVar5 = this_00->data;
          pAVar7 = this_00->allocator;
          goto joined_r0x00278277;
        }
      }
      if (((_coffset | _outc) & 7U) != 0) goto switchD_002781eb_default;
      iVar39 = _coffset + 7;
      if (-1 < _coffset) {
        iVar39 = _coffset;
      }
      iVar44 = _outc + 7;
      if (-1 < _outc) {
        iVar44 = _outc;
      }
      uVar45 = iVar44 >> 3;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pMVar48->elemsize;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(iVar39 >> 3) * pMVar48->cstep *
                     (long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + (long)pMVar48->data);
      iVar39 = pMVar48->elempack;
      pAVar7 = pMVar48->allocator;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uVar15 = pMVar48->w;
      uVar16 = pMVar48->h;
      uVar50 = ((long)pMVar48->d *
                (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                (long)pMVar48->h * (long)pMVar48->w + 0xfU & 0xfffffffffffffff0) /
               (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar34 != _outd || (uVar43 != _outh || local_1d8 != _outw)) {
LAB_0027acf3:
        Mat::create(this_00,_outw,_outh,_outd,uVar45,(uVar51 >> 3) << sVar38,8,opt->blob_allocator);
        iVar34 = -100;
        if (this_00->data != (void *)0x0) {
          uVar51 = (ulong)this_00->c;
          if (this_00->cstep * uVar51 != 0) {
            if (0 < this_00->c) {
              uVar42 = (ulong)(uint)_outd;
              lVar49 = 0;
              do {
                if (0 < (int)uVar42) {
                  lVar41 = 0;
                  do {
                    auVar54 = (undefined1  [64])m_1._0_64_;
                    m_1.cstep = (long)(int)uVar16 * (long)(int)uVar15;
                    m_1.refcount = (int *)0x0;
                    m_1.data = (void *)((long)&(bottom_blob_shapes.
                                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->data +
                                       (long)(_doffset + (int)lVar41) *
                                       (long)bottom_blob_shapes.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                       m_1.cstep +
                                       uVar50 * lVar49 *
                                       (long)bottom_blob_shapes.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    m_1.elemsize = (size_t)bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    m_1._28_36_ = auVar54._28_36_;
                    m_1.elempack = iVar39;
                    m_1.allocator = pAVar7;
                    m_1.dims = 2;
                    m_1.w = uVar15;
                    m_1.h = uVar16;
                    m_1._60_4_ = auVar54._60_4_;
                    m_1.d = 1;
                    m_1.c = 1;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)this_00->data +
                                  lVar41 * (long)bottom_blobs_unpacked.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  * (long)this_00->h * (long)this_00->w +
                                  this_00->cstep * lVar49 *
                                  (long)bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    crop_pack8_avx(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                    uVar42 = (ulong)_outd;
                    lVar41 = lVar41 + 1;
                  } while (lVar41 < (long)uVar42);
                  uVar51 = (ulong)(uint)this_00->c;
                }
                lVar49 = lVar49 + 1;
              } while (lVar49 < (int)uVar51);
            }
            iVar34 = 0;
          }
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,opt->blob_allocator,_outd,(void *)(ulong)uVar45)
        ;
        piVar37 = m_1.refcount;
        auVar54 = (undefined1  [64])m_1._0_64_;
        if (this_00 != &m_1) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar37 = this_00->refcount;
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          auVar54 = (undefined1  [64])m_1._0_64_;
          this_00->data = m_1.data;
          this_00->refcount = m_1.refcount;
          this_00->elemsize = m_1.elemsize;
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          m_1.c = auVar54._56_4_;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
          piVar37 = m_1.refcount;
        }
        m_1._0_64_ = auVar54;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar34 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = _outc + 7;
          if (-1 < _outc) {
            iVar34 = _outc;
          }
          uVar45 = iVar34 >> 3;
          goto LAB_0027acf3;
        }
      }
      piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar37 == (int *)0x0) {
        return iVar34;
      }
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 != 0) {
        return iVar34;
      }
      if (pAVar7 != (Allocator *)0x0) {
        (*pAVar7->_vptr_Allocator[3])();
        return iVar34;
      }
joined_r0x0027a8e1:
      if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return iVar34;
      }
      goto LAB_0027af16;
    default:
      goto switchD_002781eb_default;
    }
  }
  if (3 < iVar44 - 1U) goto switchD_002781eb_default;
  switch(iVar44) {
  case 1:
    uVar45 = _outw & 3;
    iVar34 = (uint)(uVar45 == 0) * 3 + 1;
    uVar43 = _outw / iVar34;
    if (local_1d8 != uVar43 || uVar45 != 0) {
      if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(this_00,uVar43,(uVar51 >> 2) << (uVar45 == 0) * '\x02',iVar34,
                    opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          iVar34 = _woffset + 3;
          if (-1 < _woffset) {
            iVar34 = _woffset;
          }
          crop_pack4_sse(pMVar48,this_00,0,iVar34 >> 2);
          return 0;
        }
        return -100;
      }
      goto switchD_002781eb_default;
    }
    if (this_00 == pMVar48) {
      return 0;
    }
    piVar37 = pMVar48->refcount;
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + 1;
      UNLOCK();
    }
    piVar37 = this_00->refcount;
    if (piVar37 == (int *)0x0) goto LAB_00279c0a;
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 != 0) goto LAB_00279c0a;
    pvVar5 = this_00->data;
    pAVar7 = this_00->allocator;
    break;
  case 2:
    if (((_outw != local_1d8) || ((_outh & 3U) != 0)) ||
       (_outh / (int)((uint)((_outh & 3U) == 0) * 3 + 1) != uVar43)) {
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(this_00,_outw,_outh >> 2,(uVar51 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                    opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          iVar34 = _hoffset + 3;
          if (-1 < _hoffset) {
            iVar34 = _hoffset;
          }
          crop_pack4_sse(pMVar48,this_00,iVar34 >> 2,_woffset);
          return 0;
        }
        return -100;
      }
      goto switchD_002781eb_default;
    }
    if (this_00 == pMVar48) {
      return 0;
    }
    piVar37 = pMVar48->refcount;
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + 1;
      UNLOCK();
    }
    piVar37 = this_00->refcount;
    if (piVar37 == (int *)0x0) goto LAB_00279c0a;
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 != 0) goto LAB_00279c0a;
    pvVar5 = this_00->data;
    pAVar7 = this_00->allocator;
    break;
  case 3:
    uVar45 = _outc & 3;
    uVar43 = uVar43 ^ _outh | local_1d8 ^ _outw;
    bVar53 = uVar43 == 0;
    if (((!bVar53) || ((_outc & 3U) != 0)) ||
       (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) != iVar39)) {
      if (((_coffset | _outc) & 3U) != 0) goto switchD_002781eb_default;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pMVar48->elemsize;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(_coffset >> 2) * pMVar48->cstep *
                     (long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + (long)pMVar48->data);
      iVar39 = pMVar48->elempack;
      pAVar7 = pMVar48->allocator;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uVar17 = pMVar48->dims;
      uVar18 = pMVar48->w;
      uVar19 = pMVar48->h;
      uVar20 = pMVar48->d;
      uVar50 = ((long)pMVar48->d *
                (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                (long)pMVar48->h * (long)pMVar48->w + 0xfU & 0xfffffffffffffff0) /
               (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar53) {
        Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,opt->blob_allocator,
                   CONCAT31((int3)(uVar43 >> 8),bVar53),(void *)(ulong)(uint)_outh);
        piVar37 = m_1.refcount;
        auVar54 = (undefined1  [64])m_1._0_64_;
        if (this_00 != &m_1) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar37 = this_00->refcount;
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          auVar54 = (undefined1  [64])m_1._0_64_;
          this_00->data = m_1.data;
          this_00->refcount = m_1.refcount;
          this_00->elemsize = m_1.elemsize;
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          m_1.c = auVar54._56_4_;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
          piVar37 = m_1.refcount;
        }
        m_1._0_64_ = auVar54;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar34 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
        goto LAB_00279d52;
      }
      else {
LAB_00279d52:
        iVar34 = _outc + 3;
        if (-1 < _outc) {
          iVar34 = _outc;
        }
        Mat::create(this_00,_outw,_outh,iVar34 >> 2,(uVar51 >> 2) << (uVar45 == 0) * '\x02',4,
                    opt->blob_allocator);
        iVar34 = -100;
        if ((this_00->data != (void *)0x0) && (this_00->cstep * (long)this_00->c != 0)) {
          if (0 < this_00->c) {
            lVar49 = 0;
            do {
              auVar54 = (undefined1  [64])m_1._0_64_;
              m_1.refcount = (int *)0x0;
              m_1.data = (void **)((long)&(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->data +
                                  uVar50 * lVar49 *
                                  (long)bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
              m_1.elemsize = (size_t)bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
              m_1._28_36_ = auVar54._28_36_;
              m_1.elempack = iVar39;
              auVar33 = (undefined1  [64])m_1._0_64_;
              m_1._40_24_ = auVar54._40_24_;
              m_1._0_32_ = auVar33._0_32_;
              m_1.allocator = pAVar7;
              auVar32 = (undefined1  [40])m_1._0_40_;
              m_1.w = uVar18;
              m_1.h = uVar19;
              m_1.d = 1;
              m_1._60_4_ = auVar54._60_4_;
              m_1.c = uVar20;
              m_1.dims = uVar17 + -1;
              m_1._0_44_ = CONCAT440(m_1.dims,auVar32);
              m_1.cstep = ((long)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage *
                           (long)(int)uVar19 * (long)(int)uVar18 + 0xfU & 0xfffffffffffffff0) /
                          (ulong)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
              if (uVar17 == 4) {
                m_1.cstep = (long)(int)uVar19 * (long)(int)uVar18;
              }
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)(this_00->cstep * lVar49 *
                             (long)bottom_blobs_unpacked.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage + (long)this_00->data)
              ;
              bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
              lVar49 = lVar49 + 1;
            } while (lVar49 < this_00->c);
          }
          iVar34 = 0;
        }
      }
      piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar37 == (int *)0x0) {
        return iVar34;
      }
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 != 0) {
        return iVar34;
      }
      if (pAVar7 != (Allocator *)0x0) {
        (*pAVar7->_vptr_Allocator[3])();
        return iVar34;
      }
      goto joined_r0x00279f8c;
    }
    if (this_00 == pMVar48) {
      return 0;
    }
    piVar37 = pMVar48->refcount;
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + 1;
      UNLOCK();
    }
    piVar37 = this_00->refcount;
    if (piVar37 == (int *)0x0) goto LAB_00279c0a;
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 != 0) goto LAB_00279c0a;
    pvVar5 = this_00->data;
    pAVar7 = this_00->allocator;
    break;
  case 4:
    uVar45 = _outc & 3;
    bVar53 = iVar34 == _outd;
    bVar9 = uVar43 == _outh;
    bVar10 = local_1d8 == _outw;
    if (((!bVar53 || (!bVar9 || !bVar10)) || ((_outc & 3U) != 0)) ||
       (_outc / (int)((uint)((_outc & 3U) == 0) * 3 + 1) != iVar39)) {
      if (((_coffset | _outc) & 3U) != 0) goto switchD_002781eb_default;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pMVar48->elemsize;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)(_coffset >> 2) * pMVar48->cstep *
                     (long)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + (long)pMVar48->data);
      iVar39 = pMVar48->elempack;
      pAVar7 = pMVar48->allocator;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uVar21 = pMVar48->w;
      uVar22 = pMVar48->h;
      uVar50 = ((long)pMVar48->d *
                (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage *
                (long)pMVar48->h * (long)pMVar48->w + 0xfU & 0xfffffffffffffff0) /
               (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar53 && (bVar9 && bVar10)) {
        Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,opt->blob_allocator,_outd,
                   (void *)CONCAT71(uVar46,bVar53 && (bVar9 && bVar10)));
        piVar37 = m_1.refcount;
        auVar54 = (undefined1  [64])m_1._0_64_;
        if (this_00 != &m_1) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar37 = this_00->refcount;
          if (piVar37 != (int *)0x0) {
            LOCK();
            *piVar37 = *piVar37 + -1;
            UNLOCK();
            if (*piVar37 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          auVar54 = (undefined1  [64])m_1._0_64_;
          this_00->data = m_1.data;
          this_00->refcount = m_1.refcount;
          this_00->elemsize = m_1.elemsize;
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          m_1.c = auVar54._56_4_;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
          piVar37 = m_1.refcount;
        }
        m_1._0_64_ = auVar54;
        if (piVar37 != (int *)0x0) {
          LOCK();
          *piVar37 = *piVar37 + -1;
          UNLOCK();
          if (*piVar37 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar34 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0))
        goto LAB_0027a398;
      }
      else {
LAB_0027a398:
        iVar34 = _outc + 3;
        if (-1 < _outc) {
          iVar34 = _outc;
        }
        Mat::create(this_00,_outw,_outh,_outd,iVar34 >> 2,(uVar51 >> 2) << (uVar45 == 0) * '\x02',4,
                    opt->blob_allocator);
        iVar34 = -100;
        if (this_00->data != (void *)0x0) {
          uVar51 = (ulong)this_00->c;
          if (this_00->cstep * uVar51 != 0) {
            if (0 < this_00->c) {
              uVar42 = (ulong)(uint)_outd;
              lVar49 = 0;
              do {
                if (0 < (int)uVar42) {
                  lVar41 = 0;
                  do {
                    auVar54 = (undefined1  [64])m_1._0_64_;
                    m_1.cstep = (long)(int)uVar22 * (long)(int)uVar21;
                    m_1.refcount = (int *)0x0;
                    m_1.data = (void *)((long)&(bottom_blob_shapes.
                                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->data +
                                       (long)(_doffset + (int)lVar41) *
                                       (long)bottom_blob_shapes.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                       m_1.cstep +
                                       uVar50 * lVar49 *
                                       (long)bottom_blob_shapes.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    m_1.elemsize = (size_t)bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    m_1._28_36_ = auVar54._28_36_;
                    m_1.elempack = iVar39;
                    m_1.allocator = pAVar7;
                    m_1.dims = 2;
                    m_1.w = uVar21;
                    m_1.h = uVar22;
                    m_1._60_4_ = auVar54._60_4_;
                    m_1.d = 1;
                    m_1.c = 1;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)this_00->data +
                                  (long)this_00->h *
                                  (long)bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                                  lVar41 * this_00->w +
                                  this_00->cstep * lVar49 *
                                  (long)bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    crop_pack4_sse(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                    uVar42 = (ulong)_outd;
                    lVar41 = lVar41 + 1;
                  } while (lVar41 < (long)uVar42);
                  uVar51 = (ulong)(uint)this_00->c;
                }
                lVar49 = lVar49 + 1;
              } while (lVar49 < (int)uVar51);
            }
            iVar34 = 0;
          }
        }
      }
      piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar37 == (int *)0x0) {
        return iVar34;
      }
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 != 0) {
        return iVar34;
      }
      if (pAVar7 != (Allocator *)0x0) {
        (*pAVar7->_vptr_Allocator[3])();
        return iVar34;
      }
      goto joined_r0x0027a8e1;
    }
    if (this_00 == pMVar48) {
      return 0;
    }
    piVar37 = pMVar48->refcount;
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + 1;
      UNLOCK();
    }
    piVar37 = this_00->refcount;
    if (piVar37 == (int *)0x0) goto LAB_00279c0a;
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 != 0) goto LAB_00279c0a;
    pvVar5 = this_00->data;
    pAVar7 = this_00->allocator;
  }
joined_r0x00278277:
  if (pAVar7 == (Allocator *)0x0) {
    if (pvVar5 != (void *)0x0) {
      free(pvVar5);
    }
  }
  else {
    (*pAVar7->_vptr_Allocator[3])();
  }
LAB_00279c0a:
  this_00->cstep = 0;
  this_00->data = (void *)0x0;
  this_00->refcount = (int *)0x0;
  *(undefined1 (*) [16])((long)&this_00->refcount + 4) = (undefined1  [16])0x0;
  this_00->dims = 0;
  this_00->w = 0;
  this_00->h = 0;
  this_00->d = 0;
  this_00->c = 0;
  piVar37 = pMVar48->refcount;
  this_00->data = pMVar48->data;
  this_00->refcount = piVar37;
  this_00->elemsize = pMVar48->elemsize;
  this_00->elempack = pMVar48->elempack;
  this_00->allocator = pMVar48->allocator;
  iVar34 = pMVar48->w;
  iVar39 = pMVar48->h;
  iVar44 = pMVar48->d;
  this_00->dims = pMVar48->dims;
  this_00->w = iVar34;
  this_00->h = iVar39;
  this_00->d = iVar44;
  this_00->c = pMVar48->c;
  this_00->cstep = pMVar48->cstep;
  return 0;
switchD_002781eb_caseD_3:
  sVar38 = 3;
  if ((_outc & 7U) != 0) {
    sVar38 = ((_outc & 3U) == 0) * '\x02';
  }
  if (uVar43 == _outh && local_1d8 == _outw) {
    iVar34 = 8;
    if ((_outc & 7U) != 0) {
      iVar34 = (uint)((_outc & 3U) == 0) * 3 + 1;
    }
    if (((_outc & 7U) == 0) && (_outc / iVar34 == iVar39)) {
      if (this_00 == pMVar48) {
        return 0;
      }
      piVar37 = pMVar48->refcount;
      if (piVar37 != (int *)0x0) {
        LOCK();
        *piVar37 = *piVar37 + 1;
        UNLOCK();
      }
      piVar37 = this_00->refcount;
      if (piVar37 == (int *)0x0) goto LAB_00279c0a;
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 != 0) goto LAB_00279c0a;
      pvVar5 = this_00->data;
      pAVar7 = this_00->allocator;
      goto joined_r0x00278277;
    }
  }
  if (((_coffset | _outc) & 7U) != 0) goto switchD_002781eb_default;
  iVar34 = _coffset + 7;
  if (-1 < _coffset) {
    iVar34 = _coffset;
  }
  iVar39 = _outc + 7;
  if (-1 < _outc) {
    iVar39 = _outc;
  }
  iVar39 = iVar39 >> 3;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pMVar48->elemsize;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)(iVar34 >> 3) * pMVar48->cstep *
                 (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + (long)pMVar48->data);
  iVar44 = pMVar48->elempack;
  pAVar7 = pMVar48->allocator;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  uVar11 = pMVar48->dims;
  uVar12 = pMVar48->w;
  uVar13 = pMVar48->h;
  uVar14 = pMVar48->d;
  uVar50 = ((long)pMVar48->d *
            (long)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage *
            (long)pMVar48->h * (long)pMVar48->w + 0xfU & 0xfffffffffffffff0) /
           (ulong)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (uVar43 != _outh || local_1d8 != _outw) {
LAB_0027a9cf:
    Mat::create(this_00,_outw,_outh,iVar39,(uVar51 >> 3) << sVar38,8,opt->blob_allocator);
    iVar34 = -100;
    if ((this_00->data != (void *)0x0) && (this_00->cstep * (long)this_00->c != 0)) {
      if (0 < this_00->c) {
        lVar49 = 0;
        do {
          auVar54 = (undefined1  [64])m_1._0_64_;
          m_1.refcount = (int *)0x0;
          m_1.data = (void **)((long)&(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->data +
                              uVar50 * lVar49 *
                              (long)bottom_blob_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          m_1.elemsize = (size_t)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          m_1._28_36_ = auVar54._28_36_;
          m_1.elempack = iVar44;
          auVar33 = (undefined1  [64])m_1._0_64_;
          m_1._40_24_ = auVar54._40_24_;
          m_1._0_32_ = auVar33._0_32_;
          m_1.allocator = pAVar7;
          auVar32 = (undefined1  [40])m_1._0_40_;
          m_1.w = uVar12;
          m_1.h = uVar13;
          m_1.d = 1;
          m_1._60_4_ = auVar54._60_4_;
          m_1.c = uVar14;
          m_1.dims = uVar11 + -1;
          m_1._0_44_ = CONCAT440(m_1.dims,auVar32);
          m_1.cstep = ((long)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage *
                       (long)(int)uVar13 * (long)(int)uVar12 + 0xfU & 0xfffffffffffffff0) /
                      (ulong)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
          if (uVar11 == 4) {
            m_1.cstep = (long)(int)uVar13 * (long)(int)uVar12;
          }
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)this_00->elemsize;
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(this_00->cstep * lVar49 *
                         (long)bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + (long)this_00->data);
          bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          crop_pack8_avx(&m_1,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
          lVar49 = lVar49 + 1;
        } while (lVar49 < this_00->c);
      }
      iVar34 = 0;
    }
  }
  else {
    Mat::clone(&m_1,(__fn *)&bottom_blob_shapes,opt->blob_allocator,iVar39,
               (void *)(ulong)(uint)_outh);
    piVar37 = m_1.refcount;
    auVar54 = (undefined1  [64])m_1._0_64_;
    if (this_00 != &m_1) {
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + 1;
        UNLOCK();
      }
      piVar37 = this_00->refcount;
      if (piVar37 != (int *)0x0) {
        LOCK();
        *piVar37 = *piVar37 + -1;
        UNLOCK();
        if (*piVar37 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            if (this_00->data != (void *)0x0) {
              free(this_00->data);
            }
          }
          else {
            (*this_00->allocator->_vptr_Allocator[3])();
          }
        }
      }
      auVar54 = (undefined1  [64])m_1._0_64_;
      this_00->data = m_1.data;
      this_00->refcount = m_1.refcount;
      this_00->elemsize = m_1.elemsize;
      this_00->elempack = m_1.elempack;
      this_00->allocator = m_1.allocator;
      this_00->dims = m_1.dims;
      this_00->w = m_1.w;
      this_00->h = m_1.h;
      this_00->d = m_1.d;
      m_1.c = auVar54._56_4_;
      this_00->c = m_1.c;
      this_00->cstep = m_1.cstep;
      piVar37 = m_1.refcount;
    }
    m_1._0_64_ = auVar54;
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (m_1.allocator == (Allocator *)0x0) {
          if (m_1.data != (void *)0x0) {
            free(m_1.data);
          }
        }
        else {
          (*(m_1.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar34 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar39 = _outc + 7;
      if (-1 < _outc) {
        iVar39 = _outc;
      }
      iVar39 = iVar39 >> 3;
      goto LAB_0027a9cf;
    }
  }
  piVar37 = (int *)CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar37 == (int *)0x0) {
    return iVar34;
  }
  LOCK();
  *piVar37 = *piVar37 + -1;
  UNLOCK();
  if (*piVar37 != 0) {
    return iVar34;
  }
  if (pAVar7 != (Allocator *)0x0) {
    (*pAVar7->_vptr_Allocator[3])();
    return iVar34;
  }
joined_r0x00279f8c:
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar34;
  }
LAB_0027af16:
  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_start);
  return iVar34;
}

Assistant:

int Crop_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}